

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O3

void __thiscall Psbt_EmptyObject_Test::TestBody(Psbt_EmptyObject_Test *this)

{
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *pvVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  Psbt empty_obj;
  AssertHelper local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  ByteData local_c8;
  Transaction local_b0;
  uint local_6c;
  Psbt local_68;
  
  cfd::core::Psbt::Psbt(&local_68);
  local_d8.data_._0_4_ = 2;
  cfd::core::Psbt::GetTransaction(&local_b0,&local_68);
  local_6c = cfd::core::AbstractTransaction::GetVersion(&local_b0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"2","empty_obj.GetTransaction().GetVersion()",(int *)&local_d8,
             (int *)&local_6c);
  cfd::core::Transaction::~Transaction(&local_b0);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.data_._0_4_ = 0;
  cfd::core::Psbt::GetTransaction(&local_b0,&local_68);
  local_6c = cfd::core::AbstractTransaction::GetLockTime(&local_b0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_c8,"0","empty_obj.GetTransaction().GetLockTime()",(int *)&local_d8,
             &local_6c);
  cfd::core::Transaction::~Transaction(&local_b0);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetDataSize(&local_68);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"19","empty_obj.GetDataSize()",(int *)&local_c8,(uint *)&local_d8
            );
  if ((char)local_b0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_b0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_b0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData(&local_c8,&local_68);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_b0,&local_c8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"\"70736274ff01000a0200000000000000000000\"",
             "empty_obj.GetData().GetHex().c_str()","70736274ff01000a0200000000000000000000",
             (char *)local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != &local_b0.vin_) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((void *)CONCAT44(local_c8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_c8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_c8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&local_b0,&local_68);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,"\"cHNidP8BAAoCAAAAAAAAAAAAAA==\"",
             "empty_obj.GetBase64().c_str()","cHNidP8BAAoCAAAAAAAAAAAAAA==",
             (char *)local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != &local_b0.vin_) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetPsbtVersion(&local_68);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"0","empty_obj.GetPsbtVersion()",(int *)&local_c8,
             (uint *)&local_d8);
  if ((char)local_b0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_b0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_b0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(&local_68);
  cfd::core::Psbt::Psbt(&local_68,1,100);
  local_d8.data_._0_4_ = 1;
  cfd::core::Psbt::GetTransaction(&local_b0,&local_68);
  local_6c = cfd::core::AbstractTransaction::GetVersion(&local_b0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"1","obj.GetTransaction().GetVersion()",(int *)&local_d8,
             (int *)&local_6c);
  cfd::core::Transaction::~Transaction(&local_b0);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.data_._0_4_ = 100;
  cfd::core::Psbt::GetTransaction(&local_b0,&local_68);
  local_6c = cfd::core::AbstractTransaction::GetLockTime(&local_b0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_c8,"100","obj.GetTransaction().GetLockTime()",(int *)&local_d8,
             &local_6c);
  cfd::core::Transaction::~Transaction(&local_b0);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetDataSize(&local_68);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"19","obj.GetDataSize()",(int *)&local_c8,(uint *)&local_d8);
  if ((char)local_b0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_b0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_b0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData(&local_c8,&local_68);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_b0,&local_c8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"\"70736274ff01000a0100000000006400000000\"",
             "obj.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",
             (char *)local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != &local_b0.vin_) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((void *)CONCAT44(local_c8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_c8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_c8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&local_b0,&local_68);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","obj.GetBase64().c_str()",
             "cHNidP8BAAoBAAAAAABkAAAAAA==",
             (char *)local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != &local_b0.vin_) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_b0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(&local_68);
  pvVar1 = &local_b0.vin_;
  local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"cHNidP8BAAoBAAAAAABkAAAAAA==","");
  cfd::core::Psbt::Psbt(&local_68,(string *)&local_b0);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_d8.data_._0_4_ = 1;
  cfd::core::Psbt::GetTransaction(&local_b0,&local_68);
  local_6c = cfd::core::AbstractTransaction::GetVersion(&local_b0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"1","from_b64.GetTransaction().GetVersion()",(int *)&local_d8,
             (int *)&local_6c);
  cfd::core::Transaction::~Transaction(&local_b0);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_b0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.data_._0_4_ = 100;
  cfd::core::Psbt::GetTransaction(&local_b0,&local_68);
  local_6c = cfd::core::AbstractTransaction::GetLockTime(&local_b0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_c8,"100","from_b64.GetTransaction().GetLockTime()",(int *)&local_d8,
             &local_6c);
  cfd::core::Transaction::~Transaction(&local_b0);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_b0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetDataSize(&local_68);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"19","from_b64.GetDataSize()",(int *)&local_c8,(uint *)&local_d8)
  ;
  if ((char)local_b0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_b0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_b0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_c8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_c8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData(&local_c8,&local_68);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_b0,&local_c8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"\"70736274ff01000a0100000000006400000000\"",
             "from_b64.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",
             (char *)local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((void *)CONCAT44(local_c8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_c8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_c8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_b0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&local_b0,&local_68);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","from_b64.GetBase64().c_str()"
             ,"cHNidP8BAAoBAAAAAABkAAAAAA==",
             (char *)local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_b0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_b0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(&local_68);
  return;
}

Assistant:

TEST(Psbt, EmptyObject) {
  try {
    Psbt empty_obj;
    EXPECT_EQ(2, empty_obj.GetTransaction().GetVersion());
    EXPECT_EQ(0, empty_obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, empty_obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0200000000000000000000",
        empty_obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoCAAAAAAAAAAAAAA==", empty_obj.GetBase64().c_str());
    EXPECT_EQ(0, empty_obj.GetPsbtVersion());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt obj(1, 100);
    EXPECT_EQ(1, obj.GetTransaction().GetVersion());
    EXPECT_EQ(100, obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt from_b64("cHNidP8BAAoBAAAAAABkAAAAAA==");
    EXPECT_EQ(1, from_b64.GetTransaction().GetVersion());
    EXPECT_EQ(100, from_b64.GetTransaction().GetLockTime());
    EXPECT_EQ(19, from_b64.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        from_b64.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", from_b64.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}